

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  value_type *__v;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  size_t sVar1;
  int iVar2;
  uint32_t *puVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  SPIRVariable *pSVar13;
  SPIRType *pSVar14;
  Meta *pMVar15;
  SPIRConstant *pSVar16;
  mapped_type *pmVar17;
  mapped_type *this_02;
  SPIRVariable *pSVar18;
  SPIRExpression *pSVar19;
  CompilerError *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  undefined4 in_register_00000014;
  ID id;
  string *this_04;
  TypeID *pTVar20;
  uint32_t j;
  uint32_t index;
  uint32_t *local_140;
  uint32_t local_138;
  byte local_131;
  SPIRVariable *local_130;
  uint32_t local_128;
  uint32_t const_mbr_id;
  SPIRVariable *local_120;
  SPIRType *local_118;
  ulong local_110;
  AccessChainMeta meta;
  uint32_t local_f8;
  string e;
  string local_c8;
  SmallVector<unsigned_int,_8UL> indices;
  string local_70;
  string local_50;
  
  local_110 = CONCAT44(in_register_00000014,length);
  pSVar13 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  local_140 = ops;
  if (pSVar13 == (SPIRVariable *)0x0) {
    id.id = 0;
    goto LAB_0030c374;
  }
  pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar13);
  bVar4 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar14->super_IVariant).self.id,DecorationBlock);
  sVar1 = (pSVar14->array).super_VectorView<unsigned_int>.buffer_size;
  local_130 = pSVar13;
  bVar5 = variable_storage_requires_stage_io(this,pSVar13->storage);
  bVar6 = Compiler::has_decoration((Compiler *)this,(ID)ops[2],DecorationPatch);
  bVar8 = true;
  bVar7 = true;
  if (!bVar6) {
    bVar7 = is_patch_block(this,pSVar14);
  }
  pSVar13 = local_130;
  if (local_130->storage != StorageClassInput) {
    if (local_130->storage == StorageClassOutput) {
      bVar8 = is_tesc_shader(this);
    }
    else {
      bVar8 = false;
    }
  }
  if ((bVar7 != false) && ((!bVar4 || sVar1 != 0 || (pSVar13->storage == StorageClassInput)))) {
LAB_0030c2c5:
    id.id = (pSVar13->super_IVariant).self.id;
LAB_0030c374:
    pMVar15 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,id);
    bVar4 = is_tesc_shader(this);
    if (pSVar13 == (SPIRVariable *)0x0) {
      return false;
    }
    if (!bVar4) {
      return false;
    }
    if (pMVar15 == (Meta *)0x0) {
      return false;
    }
    if ((((pMVar15->decoration).builtin_type == BuiltInTessLevelInner) &&
        (bVar4 = Compiler::is_tessellating_triangles((Compiler *)this), bVar4)) &&
       ((pSVar16 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,local_140[3]),
        puVar3 = local_140, pSVar16 == (SPIRConstant *)0x0 || ((pSVar16->m).c[0].r[0].u32 != 1)))) {
      pSVar13 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                          ((Compiler *)this,local_140[1],pSVar13);
      *(uint32_t *)&(pSVar13->super_IVariant).field_0xc = *puVar3;
      this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      indices.super_VectorView<unsigned_int>.ptr =
           (uint *)CONCAT44(indices.super_VectorView<unsigned_int>.ptr._4_4_,puVar3[2]);
      pmVar17 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)&indices);
      e._M_dataplus._M_p._0_4_ = puVar3[1];
      this_02 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)&e);
      Meta::operator=(this_02,pmVar17);
      Compiler::inherit_expression_dependencies((Compiler *)this,puVar3[1],puVar3[2]);
      return true;
    }
    return false;
  }
  id.id = (pSVar13->super_IVariant).self.id;
  if (bVar8 == false) goto LAB_0030c374;
  uVar12 = local_140[2];
  local_128 = id.id;
  bVar6 = Compiler::is_builtin_variable((Compiler *)this,pSVar13);
  if ((bVar6 && !bVar4) &&
     ((uVar9 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(pSVar13->super_IVariant).self.id,DecorationBuiltIn),
      4 < uVar9 || (uVar9 == 2)))) goto LAB_0030c2c5;
  if ((local_128 == uVar12) && (pSVar13->storage == StorageClassOutput)) {
    if (bVar4) {
      uVar10 = 4 - bVar7;
      if ((uint)local_110 <= uVar10) goto LAB_0030c46c;
      pSVar16 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,local_140[uVar10]);
      bVar6 = CompilerGLSL::is_stage_output_block_member_masked
                        (&this->super_CompilerGLSL,pSVar13,(pSVar16->m).c[0].r[0].u32,true);
    }
    else {
      bVar6 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,pSVar13);
    }
    if (bVar6 != false) {
      return false;
    }
  }
LAB_0030c46c:
  meta.relaxed_precision = false;
  meta.access_meshlet_position_y = false;
  meta.storage_physical_type = 0;
  meta.need_transpose = false;
  meta.storage_is_packed = false;
  meta.storage_is_invariant = false;
  meta.flattened_struct = false;
  indices.super_VectorView<unsigned_int>.ptr = (uint *)&indices.stack_storage;
  indices.super_VectorView<unsigned_int>.buffer_size = 0;
  indices.buffer_capacity = 8;
  uVar11 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  uVar9 = local_128;
  local_120 = (SPIRVariable *)CONCAT44(local_120._4_4_,uVar11);
  bVar6 = local_128 != uVar12;
  SmallVector<unsigned_int,_8UL>::reserve(&indices,(ulong)((int)local_110 - 2));
  puVar3 = local_140;
  iVar2 = -((uint)bVar6 + (uint)bVar7);
  uVar10 = iVar2 + 4;
  if (bVar7 == false) {
    local_f8 = this->next_metal_resource_ids[(ulong)(local_130->storage != StorageClassInput) + 0xc]
    ;
    if (uVar9 != uVar12) goto LAB_0030c537;
    SmallVector<unsigned_int,_8UL>::push_back(&indices,local_140 + ((ulong)uVar10 - 1));
    local_138 = local_f8;
  }
  else {
    local_138 = this->next_metal_resource_ids[(ulong)(local_130->storage != StorageClassInput) + 10]
    ;
    local_f8 = local_138;
    if (uVar9 != uVar12) {
LAB_0030c537:
      local_138 = local_140[2];
    }
  }
  local_118 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*puVar3);
  const_mbr_id = (uint32_t)local_120;
  index = Compiler::get_extended_decoration
                    ((Compiler *)this,puVar3[2],SPIRVCrossDecorationInterfaceMemberIndex);
  local_131 = !bVar5;
  bVar6 = true;
  if (local_128 != uVar12 && !(bool)local_131) {
    pSVar14 = Compiler::expression_type((Compiler *)this,local_138);
    bVar8 = Compiler::is_array((Compiler *)this,pSVar14);
    if (!bVar8) {
      bVar6 = Compiler::is_matrix((Compiler *)this,pSVar14);
      bVar6 = bVar6 || *(int *)&(pSVar14->super_IVariant).field_0xc == 0xf;
    }
  }
  uVar9 = const_mbr_id;
  local_120 = (SPIRVariable *)(local_110 & 0xffffffff);
  if ((bVar4 || bVar5) && (bVar6)) {
    pSVar14 = Compiler::get_variable_element_type((Compiler *)this,local_130);
    pSVar13 = local_130;
    if ((index == 0xffffffff) && (uVar10 < (uint)local_110)) {
      pSVar16 = Compiler::get_constant((Compiler *)this,(ConstantID)local_140[uVar10]);
      pSVar13 = local_130;
      uVar10 = (pSVar16->m).c[0].r[0].u32;
      index = Compiler::get_extended_member_decoration
                        ((Compiler *)this,(local_130->super_IVariant).self.id,uVar10,
                         SPIRVCrossDecorationInterfaceMemberIndex);
      if (index == 0xffffffff) {
        __assert_fail("index != uint32_t(-1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x1f3e,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      pSVar14 = Compiler::get<spirv_cross::SPIRType>
                          ((Compiler *)this,
                           (pSVar14->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [uVar10].id);
      uVar10 = iVar2 + 5;
    }
    for (pSVar18 = (SPIRVariable *)(ulong)uVar10; bVar4 = pSVar18 < local_120, bVar5 && bVar4;
        pSVar18 = (SPIRVariable *)((long)&(pSVar18->super_IVariant)._vptr_IVariant + 1)) {
      bVar4 = Compiler::is_array((Compiler *)this,pSVar14);
      if (((!bVar4) && (bVar4 = Compiler::is_matrix((Compiler *)this,pSVar14), !bVar4)) &&
         (*(int *)&(pSVar14->super_IVariant).field_0xc != 0xf)) {
        bVar4 = true;
        break;
      }
      pSVar16 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                          ((Compiler *)this,local_140[(long)pSVar18]);
      if ((pSVar16 == (SPIRConstant *)0x0) || (pSVar16->specialization == true)) {
        this_03 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&e,
                   "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                   ,(allocator *)&local_c8);
        CompilerError::CompilerError(this_03,&e);
        __cxa_throw(this_03,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((*(int *)&(pSVar14->super_IVariant).field_0xc == 0xf) &&
         (pSVar13->storage == StorageClassOutput)) {
        uVar9 = (pSVar16->m).c[0].r[0].u32;
        for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          bVar4 = CompilerGLSL::is_stage_output_block_member_masked
                            (&this->super_CompilerGLSL,local_130,uVar11,true);
          if (!bVar4) {
            index = index + 1;
          }
        }
      }
      else {
        index = index + (pSVar16->m).c[0].r[0].u32;
      }
      pSVar13 = local_130;
      uVar9 = (pSVar14->parent_type).id;
      if (uVar9 == 0) {
        if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xf) {
          uVar9 = (pSVar14->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                  [(pSVar16->m).c[0].r[0].u32].id;
          goto LAB_0030c800;
        }
      }
      else {
LAB_0030c800:
        pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
      }
    }
    if ((bVar5) &&
       ((bVar5 = Compiler::is_matrix((Compiler *)this,local_118), bVar5 ||
        (bVar5 = Compiler::is_array((Compiler *)this,local_118),
        bVar5 || *(int *)&(local_118->super_IVariant).field_0xc == 0xf)))) {
      if ((int)pSVar18 != (uint)local_110) {
        __assert_fail("i == length",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x1f79,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
LAB_0030c903:
      if (index != 0xffffffff) {
        Compiler::set_extended_decoration
                  ((Compiler *)this,local_140[1],SPIRVCrossDecorationInterfaceMemberIndex,index);
        goto LAB_0030c934;
      }
    }
    else {
      uVar9 = const_mbr_id;
      local_130 = pSVar18;
      e._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
      local_c8._M_dataplus._M_p._0_1_ = 0;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,uVar9,(uint *)&e,&index,(bool *)&local_c8);
      SmallVector<unsigned_int,_8UL>::push_back(&indices,&const_mbr_id);
      index = 0xffffffff;
      if (bVar4) {
        SmallVector<unsigned_int,_8UL>::insert
                  (&indices,indices.super_VectorView<unsigned_int>.ptr +
                            indices.super_VectorView<unsigned_int>.buffer_size,
                   local_140 + ((ulong)local_130 & 0xffffffff),local_140 + (long)local_120);
        goto LAB_0030c903;
      }
    }
    Compiler::unset_extended_decoration
              ((Compiler *)this,local_140[1],SPIRVCrossDecorationInterfaceMemberIndex);
  }
  else {
    if (index != 0xffffffff) {
      uVar11 = get_uint_type_id(this);
      e._M_dataplus._M_p._0_4_ = uVar11;
      local_c8._M_dataplus._M_p._0_1_ = 0;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,uVar9,(uint *)&e,&index,(bool *)&local_c8);
      SmallVector<unsigned_int,_8UL>::push_back(&indices,&const_mbr_id);
    }
    puVar3 = local_140;
    index = 0xffffffff;
    Compiler::unset_extended_decoration
              ((Compiler *)this,local_140[1],SPIRVCrossDecorationInterfaceMemberIndex);
    SmallVector<unsigned_int,_8UL>::insert
              (&indices,indices.super_VectorView<unsigned_int>.ptr +
                        indices.super_VectorView<unsigned_int>.buffer_size,puVar3 + uVar10,
               puVar3 + (long)local_120);
    pSVar13 = local_130;
  }
LAB_0030c934:
  e._M_dataplus._M_p = (pointer)&e.field_2;
  e._M_string_length = 0;
  e.field_2._M_local_buf[0] = '\0';
  if (local_128 == uVar12) {
    CompilerGLSL::access_chain_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,local_138,
               indices.super_VectorView<unsigned_int>.ptr,
               (uint32_t)indices.super_VectorView<unsigned_int>.buffer_size,local_118,&meta,
               (bool)(bVar7 ^ 1));
  }
  else {
    pSVar19 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,local_138);
    local_131 = local_131 | pSVar19 == (SPIRExpression *)0x0;
    if ((local_131 == 0) &&
       (bVar6 && (pSVar19->implied_read_expressions).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 2)) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_138,true);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             indices.super_VectorView<unsigned_int>.ptr;
      CompilerGLSL::access_chain_internal_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,local_f8,
                 indices.super_VectorView<unsigned_int>.ptr,
                 (uint32_t)indices.super_VectorView<unsigned_int>.buffer_size,2,&meta);
      join<std::__cxx11::string,std::__cxx11::string>
                (&local_c8,(spirv_cross *)&local_50,&local_70,ts_1);
      ::std::__cxx11::string::operator=((string *)&e,(string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_70);
      this_04 = &local_50;
      goto LAB_0030caae;
    }
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,local_138,
               indices.super_VectorView<unsigned_int>.ptr,
               (uint32_t)indices.super_VectorView<unsigned_int>.buffer_size,0,&meta);
  }
  this_04 = &local_c8;
  ::std::__cxx11::string::operator=((string *)&e,(string *)this_04);
LAB_0030caae:
  ::std::__cxx11::string::~string((string *)this_04);
  pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar13);
  bVar4 = Compiler::has_extended_decoration
                    ((Compiler *)this,local_140[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
  if (bVar4) {
    uVar12 = Compiler::get_extended_decoration
                       ((Compiler *)this,local_140[2],SPIRVCrossDecorationTessIOOriginalInputTypeID)
    ;
    pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar12);
  }
  for (pSVar18 = (SPIRVariable *)0x3; pSVar18 < local_120;
      pSVar18 = (SPIRVariable *)((long)&(pSVar18->super_IVariant)._vptr_IVariant + 1)) {
    bVar4 = Compiler::is_array((Compiler *)this,pSVar14);
    if ((bVar4) || (*(int *)&(pSVar14->super_IVariant).field_0xc != 0xf)) {
      pTVar20 = &pSVar14->parent_type;
    }
    else {
      pSVar16 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,local_140[(long)pSVar18]);
      pTVar20 = (pSVar14->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr +
                (pSVar16->m).c[0].r[0].u32;
    }
    pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,pTVar20->id);
  }
  bVar4 = Compiler::is_array((Compiler *)this,pSVar14);
  if ((((!bVar4) && (bVar4 = Compiler::is_matrix((Compiler *)this,pSVar14), !bVar4)) &&
      (*(int *)&(pSVar14->super_IVariant).field_0xc != 0xf)) &&
     (local_118->vecsize < pSVar14->vecsize)) {
    CompilerGLSL::vector_swizzle(local_118->vecsize,0);
    ::std::__cxx11::string::append((char *)&e);
  }
  puVar3 = local_140;
  uVar12 = local_140[1];
  local_c8._M_dataplus._M_p._0_1_ =
       CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_140[2]);
  pSVar19 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                      ((Compiler *)this,uVar12,&e,puVar3,(bool *)&local_c8);
  __v = puVar3 + 1;
  (pSVar19->loaded_from).id = (pSVar13->super_IVariant).self.id;
  pSVar19->need_transpose = meta.need_transpose;
  pSVar19->access_chain = true;
  if (meta.storage_is_packed == true) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*__v,SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  if (meta.storage_physical_type != 0) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*__v,SPIRVCrossDecorationPhysicalTypeID,meta.storage_physical_type);
  }
  if (meta.storage_is_invariant == true) {
    Compiler::set_decoration((Compiler *)this,(ID)*__v,DecorationInvariant,0);
  }
  Compiler::set_extended_decoration
            ((Compiler *)this,*__v,SPIRVCrossDecorationTessIOOriginalInputTypeID,
             (pSVar14->super_IVariant).self.id);
  this_01 = &(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries;
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)this_01,__v);
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking,__v);
  puVar3 = local_140;
  for (pSVar13 = (SPIRVariable *)0x2; pSVar13 < local_120;
      pSVar13 = (SPIRVariable *)((long)&(pSVar13->super_IVariant)._vptr_IVariant + 1)) {
    Compiler::inherit_expression_dependencies((Compiler *)this,puVar3[1],puVar3[(long)pSVar13]);
    Compiler::add_implied_read_expression((Compiler *)this,pSVar19,puVar3[(long)pSVar13]);
  }
  if ((pSVar19->expression_dependencies).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 0) {
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&this_01->_M_h,__v);
  }
  ::std::__cxx11::string::~string((string *)&e);
  SmallVector<unsigned_int,_8UL>::~SmallVector(&indices);
  return true;
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool flatten_composites = false;

	bool is_block = false;
	bool is_arrayed = false;

	if (var)
	{
		auto &type = get_variable_data_type(*var);
		is_block = has_decoration(type.self, DecorationBlock);
		is_arrayed = !type.array.empty();

		flatten_composites = variable_storage_requires_stage_io(var->storage);
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(type);

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput || (var->storage == StorageClassOutput && is_tesc_shader());

		// Patch inputs are treated as normal block IO variables, so they don't deal with this path at all.
		if (patch && (!is_block || is_arrayed || var->storage == StorageClassInput))
			flat_data = false;

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		// Also, skip ptr chain for patches.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	bool builtin_variable = false;
	bool variable_is_flat = false;

	if (var && flat_data)
	{
		builtin_variable = is_builtin_variable(*var);

		BuiltIn bi_type = BuiltInMax;
		if (builtin_variable && !is_block)
			bi_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

		variable_is_flat = !builtin_variable || is_block ||
		                   bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
		                   bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance;
	}

	if (variable_is_flat)
	{
		// If output is masked, it is emitted as a "normal" variable, just go through normal code paths.
		// Only check this for the first level of access chain.
		// Dealing with this for partial access chains should be possible, but awkward.
		if (var->storage == StorageClassOutput && !ptr_is_chain)
		{
			bool masked = false;
			if (is_block)
			{
				uint32_t relevant_member_index = patch ? 3 : 4;
				// FIXME: This won't work properly if the application first access chains into gl_out element,
				// then access chains into the member. Super weird, but theoretically possible ...
				if (length > relevant_member_index)
				{
					uint32_t mbr_idx = get<SPIRConstant>(ops[relevant_member_index]).scalar();
					masked = is_stage_output_block_member_masked(*var, mbr_idx, true);
				}
			}
			else if (var)
				masked = is_stage_output_variable_masked(*var);

			if (masked)
				return false;
		}

		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = (ptr_is_chain ? 3 : 4) - (patch ? 1 : 0);

		VariableID stage_var_id;
		if (patch)
			stage_var_id = var->storage == StorageClassInput ? patch_stage_in_var_id : patch_stage_out_var_id;
		else
			stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;

		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain && !patch)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[first_non_array_index - 1]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);

		// If we have a pointer chain expression, and we are no longer pointing to a composite
		// object, we are in the clear. There is no longer a need to flatten anything.
		bool further_access_chain_is_trivial = false;
		if (ptr_is_chain && flatten_composites)
		{
			auto &ptr_type = expression_type(ptr);
			if (!is_array(ptr_type) && !is_matrix(ptr_type) && ptr_type.basetype != SPIRType::Struct)
				further_access_chain_is_trivial = true;
		}

		if (!further_access_chain_is_trivial && (flatten_composites || is_block))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				uint32_t mbr_idx = get_constant(ops[first_non_array_index]).scalar();
				index = get_extended_member_decoration(var->self, mbr_idx,
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[mbr_idx]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; flatten_composites && i < length; ++i)
			{
				if (!is_array(*type) && !is_matrix(*type) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				if (type->basetype == SPIRType::Struct && var->storage == StorageClassOutput)
				{
					// Need to consider holes, since individual block members might be masked away.
					uint32_t mbr_idx = c->scalar();
					for (uint32_t j = 0; j < mbr_idx; j++)
						if (!is_stage_output_block_member_masked(*var, j, true))
							index++;
				}
				else
					index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			// We're not going to emit the actual member name, we let any further OpLoad take care of that.
			// Tag the access chain with the member index we're referencing.
			bool defer_access_chain = flatten_composites && (is_matrix(result_ptr_type) || is_array(result_ptr_type) ||
			                                                 result_ptr_type.basetype == SPIRType::Struct);

			if (!defer_access_chain)
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Member index is now irrelevant.
				index = uint32_t(-1);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
			else
			{
				// We must have consumed the entire access chain if we're deferring it.
				assert(i == length);
			}

			if (index != uint32_t(-1))
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			else
				unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);
		}
		else
		{
			if (index != uint32_t(-1))
			{
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);
			}

			// Member index is now irrelevant.
			index = uint32_t(-1);
			unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);

			indices.insert(indices.end(), ops + first_non_array_index, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, !patch);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			bool split_access_chain_formulation = flatten_composites && ptr_expr &&
			                                      ptr_expr->implied_read_expressions.size() == 2 &&
			                                      !further_access_chain_is_trivial;

			if (split_access_chain_formulation)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], std::move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (is_tesc_shader() && var && m && m->decoration.builtin_type == BuiltInTessLevelInner &&
	    is_tessellating_triangles())
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}